

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O3

void predict_or_learn<true,false,true,true>(oaa *o,single_learner *base,example *ec)

{
  polyprediction *ppVar1;
  float fVar2;
  uint uVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ostream *poVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  features *this;
  uint64_t uVar16;
  ulong uVar17;
  uint uVar18;
  polyprediction *ppVar19;
  float fVar20;
  float fVar21;
  v_array<float> scores_array;
  stringstream outputStringStream;
  v_array<float> local_1d8;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  uVar3 = (ec->l).multi.label;
  fVar2 = (ec->l).simple.weight;
  if (((ulong)uVar3 == 0) || ((uVar3 != 0xffffffff && (o->k < (ulong)uVar3)))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"label ",6);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," is not in {1,",0xe);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"} This won\'t work right.",0x18);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  ppVar1 = &ec->pred;
  local_1d8._begin = (ec->pred).scalars._begin;
  local_1d8._end = (ec->pred).scalars._end;
  local_1d8.end_array._0_4_ = *(undefined4 *)((long)&ec->pred + 0x10);
  local_1d8.end_array._4_4_ = *(undefined4 *)((long)&ec->pred + 0x14);
  local_1d8.erase_count._0_4_ = *(undefined4 *)((long)&ec->pred + 0x18);
  local_1d8.erase_count._4_4_ = *(undefined4 *)((long)&ec->pred + 0x1c);
  (ec->l).cs.costs._begin = (wclass *)0x7f7fffff;
  (ec->l).simple.initial = 0.0;
  uVar12 = o->k;
  ppVar19 = o->pred;
  if (*(code **)(base + 0x40) == (code *)0x0) {
    uVar16 = uVar12;
    if (uVar12 == 0) {
      uVar11 = (ec->super_example_predict).ft_offset;
    }
    else {
      do {
        (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
        fVar20 = ppVar1->scalar;
        fVar21 = *(float *)((long)&ec->pred + 4);
        uVar5 = *(undefined4 *)((long)&ec->pred + 8);
        uVar6 = *(undefined4 *)((long)&ec->pred + 0xc);
        uVar7 = *(undefined4 *)((long)&ec->pred + 0x14);
        uVar8 = *(undefined4 *)((long)&ec->pred + 0x18);
        uVar9 = *(undefined4 *)((long)&ec->pred + 0x1c);
        *(undefined4 *)&(ppVar19->scalars).end_array = *(undefined4 *)((long)&ec->pred + 0x10);
        *(undefined4 *)((long)&(ppVar19->scalars).end_array + 4) = uVar7;
        *(undefined4 *)&(ppVar19->scalars).erase_count = uVar8;
        *(undefined4 *)((long)&(ppVar19->scalars).erase_count + 4) = uVar9;
        ppVar19->scalar = fVar20;
        *(float *)((long)&(ppVar19->scalars)._begin + 4) = fVar21;
        *(undefined4 *)&(ppVar19->scalars)._end = uVar5;
        *(undefined4 *)((long)&(ppVar19->scalars)._end + 4) = uVar6;
        uVar11 = (ulong)*(uint *)(base + 0xe0) + (ec->super_example_predict).ft_offset;
        (ec->super_example_predict).ft_offset = uVar11;
        ppVar19 = ppVar19 + 1;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
    }
    uVar11 = uVar11 - (uint)((int)uVar12 * *(int *)(base + 0xe0));
  }
  else {
    (**(code **)(base + 0x40))
              (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec,uVar12,
               *(undefined8 *)(base + 0xe0),ppVar19,1);
    uVar11 = (ec->super_example_predict).ft_offset;
  }
  (ec->super_example_predict).ft_offset = uVar11;
  uVar13 = o->k;
  this = ec->passthrough;
  if (uVar13 != 0 && this != (features *)0x0) {
    uVar15 = 1;
    uVar17 = 2;
    while( true ) {
      if (this != (features *)0x0) {
        features::push_back(this,o->pred[(int)uVar17 - 2].scalar,uVar15 ^ 0x398d9fda640553);
        uVar13 = o->k;
      }
      if (uVar13 < uVar17) break;
      this = ec->passthrough;
      uVar15 = uVar17;
      uVar17 = (ulong)((int)uVar17 + 1);
    }
  }
  if (uVar13 != 0) {
    uVar12 = (ec->super_example_predict).ft_offset;
    uVar18 = 0;
    do {
      (ec->l).simple.label = *(float *)(&DAT_0027c658 + (ulong)(uVar3 - 1 == uVar18) * 4);
      *(undefined8 *)((long)&(ec->l).cs.costs._begin + 4) = 0;
      (ec->pred).scalar = o->pred[uVar18].scalar;
      (ec->super_example_predict).ft_offset = uVar18 * *(int *)(base + 0xe0) + uVar12;
      (**(code **)(base + 0x38))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      uVar12 = (ec->super_example_predict).ft_offset - (ulong)(*(int *)(base + 0xe0) * uVar18);
      (ec->super_example_predict).ft_offset = uVar12;
      uVar14 = uVar18 + 2;
      uVar18 = uVar18 + 1;
    } while ((ulong)uVar14 <= o->k);
  }
  v_array<float>::clear(&local_1d8);
  if (o->k != 0) {
    uVar13 = 0;
    uVar15 = 1;
    do {
      v_array<float>::push_back(&local_1d8,&o->pred[uVar13].scalar);
      bVar4 = uVar15 < o->k;
      uVar13 = uVar15;
      uVar15 = (ulong)((int)uVar15 + 1);
    } while (bVar4);
  }
  (ec->pred).scalars.end_array =
       (float *)CONCAT44(local_1d8.end_array._4_4_,local_1d8.end_array._0_4_);
  (ec->pred).scalars.erase_count =
       CONCAT44(local_1d8.erase_count._4_4_,(undefined4)local_1d8.erase_count);
  (ppVar1->scalars)._begin = local_1d8._begin;
  (ec->pred).scalars._end = local_1d8._end;
  if (o->k != 0) {
    fVar20 = 0.0;
    uVar13 = 0;
    uVar15 = 1;
    do {
      fVar21 = expf(-(float)o->pred[uVar13].multiclass);
      (ppVar1->scalars)._begin[uVar13] = 1.0 / (fVar21 + 1.0);
      fVar20 = fVar20 + (ppVar1->scalars)._begin[uVar13];
      bVar4 = uVar15 < o->k;
      uVar13 = uVar15;
      uVar15 = (ulong)((int)uVar15 + 1);
    } while (bVar4);
    if (o->k != 0) {
      uVar18 = 1;
      uVar13 = 0;
      do {
        (ppVar1->scalars)._begin[uVar13] = (ppVar1->scalars)._begin[uVar13] * (1.0 / fVar20);
        uVar13 = (ulong)uVar18;
        uVar18 = uVar18 + 1;
      } while (uVar13 < o->k);
    }
  }
  (ec->l).multi.label = uVar3;
  (ec->l).simple.weight = fVar2;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void predict_or_learn(oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTICLASS::label_t mc_label_data = ec.l.multi;
  if (mc_label_data.label == 0 || (mc_label_data.label > o.k && mc_label_data.label != (uint32_t)-1))
    cout << "label " << mc_label_data.label << " is not in {1," << o.k << "} This won't work right." << endl;

  stringstream outputStringStream;
  uint32_t prediction = 1;
  v_array<float> scores_array;
  if (scores)
    scores_array = ec.pred.scalars;

  ec.l.simple = {FLT_MAX, 0.f, 0.f};
  base.multipredict(ec, 0, o.k, o.pred, true);
  for (uint32_t i = 2; i <= o.k; i++)
    if (o.pred[i - 1].scalar > o.pred[prediction - 1].scalar)
      prediction = i;

  if (ec.passthrough)
    for (uint32_t i = 1; i <= o.k; i++) add_passthrough_feature(ec, i, o.pred[i - 1].scalar);

  if (is_learn)
  {
    for (uint32_t i = 1; i <= o.k; i++)
    {
      ec.l.simple = {(mc_label_data.label == i) ? 1.f : -1.f, 0.f, 0.f};
      ec.pred.scalar = o.pred[i - 1].scalar;
      base.update(ec, i - 1);
    }
  }

  if (print_all)
  {
    outputStringStream << "1:" << o.pred[0].scalar;
    for (uint32_t i = 2; i <= o.k; i++) outputStringStream << ' ' << i << ':' << o.pred[i - 1].scalar;
    o.all->print_text(o.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (scores)
  {
    scores_array.clear();
    for (uint32_t i = 0; i < o.k; i++) scores_array.push_back(o.pred[i].scalar);
    ec.pred.scalars = scores_array;

    if (probabilities)
    {
      float sum_prob = 0;
      for (uint32_t i = 0; i < o.k; i++)
      {
        ec.pred.scalars[i] = 1.f / (1.f + correctedExp(-o.pred[i].scalar));
        sum_prob += ec.pred.scalars[i];
      }
      float inv_sum_prob = 1.f / sum_prob;
      for (uint32_t i = 0; i < o.k; i++) ec.pred.scalars[i] *= inv_sum_prob;
    }
  }
  else
    ec.pred.multiclass = prediction;

  ec.l.multi = mc_label_data;
}